

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O2

void __thiscall
vkt::texture::anon_unknown_0::TextureCubeLodControlTestInstance::~TextureCubeLodControlTestInstance
          (TextureCubeLodControlTestInstance *this)

{
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__TextureCubeLodControlTestInstance_00bde980;
  util::TextureRenderer::~TextureRenderer(&this->m_renderer);
  de::SharedPtr<vkt::pipeline::TestTextureCube>::release(&this->m_texture);
  std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
  ~_Vector_base(&(this->m_testParameters).super_TextureCubeTestCaseParameters.
                 super_TextureCommonTestCaseParameters.programs.
                 super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
               );
  return;
}

Assistant:

TextureCubeLodControlTestInstance::~TextureCubeLodControlTestInstance (void)
{
}